

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_encrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  undefined8 uVar4;
  int local_58;
  int local_54;
  int ret;
  int clen;
  uint8_t *dst;
  size_t hlen;
  EVP_MAC_CTX *hctx;
  EVP_MAC *mac;
  EVP_CIPHER_CTX *cctx;
  _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t src_local;
  
  src_local.base = (uint8_t *)src.len;
  buf_local = (ptls_buffer_t *)src.base;
  mac = (EVP_MAC *)0x0;
  hctx = (EVP_MAC_CTX *)0x0;
  hlen = 0;
  cctx = (EVP_CIPHER_CTX *)cb;
  cb_local = (_func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *)buf;
  mac = (EVP_MAC *)EVP_CIPHER_CTX_new();
  if ((EVP_CIPHER_CTX *)mac == (EVP_CIPHER_CTX *)0x0) {
    local_58 = 0x201;
  }
  else {
    hctx = (EVP_MAC_CTX *)EVP_MAC_fetch(0,"HMAC");
    if (hctx == (EVP_MAC_CTX *)0x0) {
      local_58 = 0x201;
    }
    else {
      hlen = EVP_MAC_CTX_new(hctx);
      if (hlen == 0) {
        local_58 = 0x201;
      }
      else {
        local_58 = ptls_buffer_reserve((ptls_buffer_t *)cb_local,(size_t)(src_local.base + 0x80));
        if (local_58 == 0) {
          _ret = (uchar *)(*(long *)cb_local + *(long *)(cb_local + 0x10));
          iVar3 = (*(code *)cctx)(_ret,_ret + 0x10,mac,hlen,1);
          if (iVar3 == 0) {
            local_58 = 0x203;
          }
          else {
            _ret = _ret + 0x20;
            iVar3 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)mac,_ret,&local_54,(uchar *)buf_local,
                                      (int)src_local.base);
            if (iVar3 == 0) {
              local_58 = 0x203;
            }
            else {
              _ret = _ret + local_54;
              iVar3 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)mac,_ret,&local_54);
              if (iVar3 == 0) {
                local_58 = 0x203;
              }
              else {
                _ret = _ret + local_54;
                iVar3 = EVP_MAC_update(hlen,*(long *)cb_local + *(long *)(cb_local + 0x10),
                                       (long)_ret - (*(long *)cb_local + *(long *)(cb_local + 0x10))
                                      );
                sVar2 = hlen;
                puVar1 = _ret;
                if (iVar3 != 0) {
                  uVar4 = EVP_MAC_CTX_get_mac_size(hlen);
                  iVar3 = EVP_MAC_final(sVar2,puVar1,&dst,uVar4);
                  if (iVar3 != 0) {
                    _ret = dst + (long)_ret;
                    if ((uchar *)(*(long *)cb_local + *(long *)(cb_local + 8)) < _ret) {
                      __assert_fail("dst <= buf->base + buf->capacity",
                                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                                    ,0x81e,
                                    "int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, EVP_MAC_CTX *, int))"
                                   );
                    }
                    *(uchar **)(cb_local + 0x10) =
                         _ret + (*(long *)(cb_local + 0x10) -
                                (*(long *)cb_local + *(long *)(cb_local + 0x10)));
                    local_58 = 0;
                    goto LAB_0013c6e6;
                  }
                }
                local_58 = 0x203;
              }
            }
          }
        }
      }
    }
  }
LAB_0013c6e6:
  if (mac != (EVP_MAC *)0x0) {
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)mac);
  }
  if (hlen != 0) {
    EVP_MAC_CTX_free(hlen);
  }
  if (hctx != (EVP_MAC_CTX *)0x0) {
    EVP_MAC_free(hctx);
  }
  return local_58;
}

Assistant:

int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!EVP_MAC_update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) ||
        !EVP_MAC_final(hctx, dst, &hlen, EVP_MAC_CTX_get_mac_size(hctx))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += hlen;

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}